

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

xmlHashTablePtr xmlHashCreateDict(int size,xmlDictPtr dict)

{
  xmlHashTablePtr pxVar1;
  
  pxVar1 = xmlHashCreate(size);
  if (pxVar1 != (xmlHashTablePtr)0x0) {
    pxVar1->dict = dict;
    xmlDictReference(dict);
  }
  return pxVar1;
}

Assistant:

xmlHashTablePtr
xmlHashCreateDict(int size, xmlDictPtr dict) {
    xmlHashTablePtr table;

    table = xmlHashCreate(size);
    if (table != NULL) {
        table->dict = dict;
	xmlDictReference(dict);
    }
    return(table);
}